

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O3

result_type_conflict2 __thiscall
trng::tent_dist<double>::icdf(tent_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  double dVar2;
  result_type_conflict2 rVar3;
  
  if ((x < 0.0) || (1.0 < x)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    rVar3 = NAN;
  }
  else {
    if (0.5 <= x) {
      dVar2 = 2.0 - (x + x);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar2 = 1.0 - dVar2;
    }
    else {
      dVar2 = x + x;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar2 = dVar2 + -1.0;
    }
    rVar3 = dVar2 * (this->P).d_ + (this->P).m_;
  }
  return rVar3;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return icdf_(x);
    }